

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O1

size_t release_unused_segments(mstate m)

{
  malloc_segment *pmVar1;
  char *pcVar2;
  size_t __len;
  malloc_tree_chunk *pmVar3;
  tbinptr pmVar4;
  tbinptr pmVar5;
  byte bVar6;
  malloc_tree_chunk *pmVar7;
  int iVar8;
  malloc_tree_chunk **ppmVar9;
  malloc_tree_chunk *pmVar10;
  tbinptr pmVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  malloc_segment *pmVar15;
  ulong uVar16;
  malloc_segment *pmVar17;
  malloc_segment *pmVar18;
  uint uVar19;
  tbinptr pmVar20;
  uint uVar21;
  size_t local_50;
  
  pmVar15 = (m->seg).next;
  if (pmVar15 == (malloc_segment *)0x0) {
    uVar19 = 0;
    local_50 = 0;
LAB_00130cbd:
    uVar12 = 0xfff;
    if (0xfff < uVar19) {
      uVar12 = (ulong)uVar19;
    }
    m->release_checks = uVar12;
    return local_50;
  }
  local_50 = 0;
  uVar19 = 0;
  pmVar17 = &m->seg;
LAB_001309ae:
  pmVar1 = pmVar15->next;
  pmVar18 = pmVar15;
  if ((pmVar15->sflags & 9) == 1) {
    pcVar2 = pmVar15->base;
    uVar16 = (ulong)(-(int)pcVar2 - 0x10U & 0xf);
    uVar12 = *(ulong *)(pcVar2 + uVar16 + 8);
    if (((uint)uVar12 & 3) != 1) goto LAB_00130a4a;
    __len = pmVar15->size;
    pmVar20 = (tbinptr)(pcVar2 + uVar16);
    uVar16 = uVar12 & 0xfffffffffffffff8;
    if ((char *)((long)pmVar20->child + (uVar16 - 0x20)) < pcVar2 + (__len - 0x50))
    goto LAB_00130a4a;
    if (pmVar20 != (tbinptr)m->dv) {
      pmVar11 = pmVar20->bk;
      pmVar10 = pmVar20->child[2];
      if (pmVar11 == pmVar20) {
        pmVar11 = pmVar20->child[1];
        if (pmVar11 != (tbinptr)0x0) {
          ppmVar9 = pmVar20->child + 1;
LAB_00130a96:
          do {
            if (pmVar11->child[1] == (malloc_tree_chunk *)0x0) {
              if (pmVar11->child[0] == (malloc_tree_chunk *)0x0) goto code_r0x00130aaa;
              ppmVar9 = pmVar11->child;
            }
            else {
              ppmVar9 = pmVar11->child + 1;
            }
            pmVar11 = *ppmVar9;
          } while( true );
        }
        pmVar11 = pmVar20->child[0];
        if (pmVar11 != (tbinptr)0x0) {
          ppmVar9 = pmVar20->child;
          goto LAB_00130a96;
        }
        pmVar11 = (tbinptr)0x0;
      }
      else {
        pmVar3 = pmVar20->fd;
        if (((pmVar3 < (malloc_tree_chunk *)m->least_addr) || (pmVar3->bk != pmVar20)) ||
           (pmVar11->fd != pmVar20)) goto LAB_00130ce5;
        pmVar3->bk = pmVar11;
        pmVar11->fd = pmVar3;
      }
      goto LAB_00130abb;
    }
    m->dv = (mchunkptr)0x0;
    m->dvsize = 0;
    goto LAB_00130b53;
  }
  goto LAB_00130a4a;
code_r0x00130aaa:
  if (ppmVar9 < m->least_addr) goto LAB_00130ce5;
  *ppmVar9 = (malloc_tree_chunk *)0x0;
LAB_00130abb:
  if (pmVar10 == (malloc_tree_chunk *)0x0) goto LAB_00130b53;
  uVar21 = *(uint *)(pmVar20->child + 3);
  if (pmVar20 == m->treebins[uVar21]) {
    m->treebins[uVar21] = pmVar11;
    if (pmVar11 == (tbinptr)0x0) {
      bVar6 = (byte)uVar21 & 0x1f;
      m->treemap = m->treemap & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
      goto LAB_00130b08;
    }
  }
  else {
    if (pmVar10 < (malloc_tree_chunk *)m->least_addr) goto LAB_00130ce5;
    if (pmVar10->child[0] == pmVar20) {
      pmVar10->child[0] = pmVar11;
    }
    else {
      pmVar10->child[1] = pmVar11;
    }
LAB_00130b08:
    if (pmVar11 == (tbinptr)0x0) goto LAB_00130b53;
  }
  pmVar4 = (tbinptr)m->least_addr;
  if (pmVar11 < pmVar4) {
LAB_00130ce5:
    abort();
  }
  pmVar11->child[2] = pmVar10;
  pmVar5 = pmVar20->child[0];
  if (pmVar5 != (tbinptr)0x0) {
    if (pmVar5 < pmVar4) goto LAB_00130ce5;
    pmVar11->child[0] = pmVar5;
    pmVar5->child[2] = pmVar11;
  }
  pmVar10 = pmVar20->child[1];
  if (pmVar10 != (malloc_tree_chunk *)0x0) {
    if (pmVar10 < (malloc_tree_chunk *)m->least_addr) goto LAB_00130ce5;
    pmVar11->child[1] = pmVar10;
    pmVar10->parent = pmVar11;
  }
LAB_00130b53:
  iVar8 = munmap(pcVar2,__len);
  if (iVar8 == 0) {
    local_50 = local_50 + __len;
    m->footprint = m->footprint - __len;
    pmVar17->next = pmVar1;
    pmVar18 = pmVar17;
  }
  else {
    uVar21 = (uint)(uVar12 >> 8);
    if (uVar21 == 0) {
      uVar13 = 0;
    }
    else {
      uVar13 = 0x1f;
      if (uVar21 < 0x10000) {
        uVar13 = ((uint)(uVar16 >> ((ulong)(byte)(0x26 - (char)LZCOUNT(uVar21)) & 0x3f)) & 1) +
                 LZCOUNT(uVar21) * 2 ^ 0x3e;
      }
    }
    pmVar10 = (malloc_tree_chunk *)(m->treebins + uVar13);
    *(uint *)(pmVar20->child + 3) = uVar13;
    pmVar20->child[0] = (malloc_tree_chunk *)0x0;
    pmVar20->child[1] = (malloc_tree_chunk *)0x0;
    if ((m->treemap >> (uVar13 & 0x1f) & 1) == 0) {
      m->treemap = m->treemap | 1 << (uVar13 & 0x1f);
      pmVar10->prev_foot = (size_t)pmVar20;
      pmVar20->child[2] = pmVar10;
      pmVar20->bk = pmVar20;
      pmVar20->fd = pmVar20;
    }
    else {
      pmVar10 = (malloc_tree_chunk *)pmVar10->prev_foot;
      uVar12 = (ulong)(byte)(0x39 - (char)(uVar13 >> 1));
      if (uVar13 == 0x1f) {
        uVar12 = 0;
      }
      lVar14 = uVar16 << (uVar12 & 0x3f);
      do {
        if ((pmVar10->head & 0xfffffffffffffff8) == uVar16) {
          if ((pmVar10 < (malloc_tree_chunk *)m->least_addr) ||
             (pmVar3 = pmVar10->fd, pmVar3 < (malloc_tree_chunk *)m->least_addr)) goto LAB_00130ce5;
          pmVar3->bk = pmVar20;
          pmVar10->fd = pmVar20;
          pmVar20->fd = pmVar3;
          pmVar20->bk = pmVar10;
          pmVar20->child[2] = (malloc_tree_chunk *)0x0;
          break;
        }
        pmVar3 = *(malloc_tree_chunk **)((long)pmVar10 + (lVar14 >> 0x3f) * -8 + 0x20);
        pmVar7 = pmVar3;
        if (pmVar3 == (malloc_tree_chunk *)0x0) {
          pcVar2 = (char *)((long)pmVar10 + (lVar14 >> 0x3f) * -8 + 0x20);
          if (pcVar2 < m->least_addr) goto LAB_00130ce5;
          *(tbinptr *)pcVar2 = pmVar20;
          pmVar20->child[2] = pmVar10;
          pmVar20->bk = pmVar20;
          pmVar20->fd = pmVar20;
          pmVar7 = pmVar10;
        }
        pmVar10 = pmVar7;
        lVar14 = lVar14 * 2;
      } while (pmVar3 != (malloc_tree_chunk *)0x0);
    }
  }
LAB_00130a4a:
  uVar19 = uVar19 + 1;
  pmVar15 = pmVar1;
  pmVar17 = pmVar18;
  if (pmVar1 == (malloc_segment *)0x0) goto LAB_00130cbd;
  goto LAB_001309ae;
}

Assistant:

static size_t release_unused_segments(mstate m) {
  size_t released = 0;
  int nsegs = 0;
  msegmentptr pred = &m->seg;
  msegmentptr sp = pred->next;
  while (sp != 0) {
    char* base = sp->base;
    size_t size = sp->size;
    msegmentptr next = sp->next;
    ++nsegs;
    if (is_mmapped_segment(sp) && !is_extern_segment(sp)) {
      mchunkptr p = align_as_chunk(base);
      size_t psize = chunksize(p);
      /* Can unmap if first chunk holds entire segment and not pinned */
      if (!is_inuse(p) && (char*)p + psize >= base + size - TOP_FOOT_SIZE) {
        tchunkptr tp = (tchunkptr)p;
        assert(segment_holds(sp, (char*)sp));
        if (p == m->dv) {
          m->dv = 0;
          m->dvsize = 0;
        }
        else {
          unlink_large_chunk(m, tp);
        }
        if (CALL_MUNMAP(base, size) == 0) {
          released += size;
          m->footprint -= size;
          /* unlink obsoleted record */
          sp = pred;
          sp->next = next;
        }
        else { /* back out if cannot unmap */
          insert_large_chunk(m, tp, psize);
        }
      }
    }
    if (NO_SEGMENT_TRAVERSAL) /* scan only first segment */
      break;
    pred = sp;
    sp = next;
  }
  /* Reset check counter */
  m->release_checks = (((size_t) nsegs > (size_t) MAX_RELEASE_CHECK_RATE)?
                       (size_t) nsegs : (size_t) MAX_RELEASE_CHECK_RATE);
  return released;
}